

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O2

void __thiscall miniros::ServicePublication::drop(ServicePublication *this)

{
  std::mutex::lock(&this->client_links_mutex_);
  this->dropped_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->client_links_mutex_);
  dropAllConnections(this);
  (*this->callback_queue_->_vptr_CallbackQueueInterface[3])(this->callback_queue_,this);
  return;
}

Assistant:

void ServicePublication::drop()
{
  // grab a lock here, to ensure that no subscription callback will
  // be invoked after we return
  {
    std::scoped_lock<std::mutex> lock(client_links_mutex_);
    dropped_ = true;
  }

  dropAllConnections();

  callback_queue_->removeByID((uint64_t)this);
}